

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall spirv_cross::CompilerGLSL::variable_is_lut(CompilerGLSL *this,SPIRVariable *var)

{
  uint32_t id;
  bool bVar1;
  SPIRConstant *pSVar2;
  
  if (((var->statically_assigned == true) && (id = (var->static_expression).id, id != 0)) &&
     (var->remapped_variable == true)) {
    pSVar2 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,id);
    if ((pSVar2 == (SPIRConstant *)0x0) || (bVar1 = true, pSVar2->is_used_as_lut == false)) {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool CompilerGLSL::variable_is_lut(const SPIRVariable &var) const
{
	bool statically_assigned = var.statically_assigned && var.static_expression != ID(0) && var.remapped_variable;

	if (statically_assigned)
	{
		auto *constant = maybe_get<SPIRConstant>(var.static_expression);
		if (constant && constant->is_used_as_lut)
			return true;
	}

	return false;
}